

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

_Bool ImGui::DockNodeIsDropAllowed
                (ImGuiWindow_conflict *host_window,ImGuiWindow_conflict *root_payload)

{
  ImGuiDockNode *pIVar1;
  _Bool _Var2;
  bool bVar3;
  uint uVar4;
  ImGuiWindow_conflict *payload;
  ulong uVar5;
  
  pIVar1 = root_payload->DockNodeAsHost;
  uVar4 = 1;
  if (pIVar1 != (ImGuiDockNode *)0x0) {
    if (pIVar1->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      return true;
    }
    if (pIVar1 != (ImGuiDockNode *)0x0) {
      uVar4 = (pIVar1->Windows).Size;
    }
  }
  bVar3 = 0 < (int)uVar4;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      payload = root_payload;
      if (pIVar1 != (ImGuiDockNode *)0x0) {
        if ((long)(pIVar1->Windows).Size <= (long)uVar5) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                        ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        payload = (pIVar1->Windows).Data[uVar5];
      }
      _Var2 = DockNodeIsDropAllowedOne(payload,host_window);
      if (_Var2) {
        return true;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    bVar3 = uVar5 < uVar4;
  }
  return bVar3;
}

Assistant:

static bool ImGui::DockNodeIsDropAllowed(ImGuiWindow* host_window, ImGuiWindow* root_payload)
{
    if (root_payload->DockNodeAsHost && root_payload->DockNodeAsHost->IsSplitNode())
        return true;

    const int payload_count = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows.Size : 1;
    for (int payload_n = 0; payload_n < payload_count; payload_n++)
    {
        ImGuiWindow* payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->Windows[payload_n] : root_payload;
        if (DockNodeIsDropAllowedOne(payload, host_window))
            return true;
    }
    return false;
}